

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAddEaRg<(moira::Instr)119,(moira::Mode)0,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Dn local_3c;
  undefined1 local_38 [4];
  Dn dst;
  Ea<(moira::Mode)0,_4> src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  Op<(moira::Mode)0,4>((Ea<(moira::Mode)0,_4> *)local_38,this,op & 7,addr);
  Dn::Dn(&local_3c,(int)(uint)op >> 9 & 7);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  pSVar1 = StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)0,_4> *)local_38);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,local_3c);
  return;
}

Assistant:

void
Moira::dasmAddEaRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}